

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

UDataSwapper *
udata_openSwapper_63
          (UBool inIsBigEndian,uint8_t inCharset,UBool outIsBigEndian,uint8_t outCharset,
          UErrorCode *pErrorCode)

{
  UBool UVar1;
  UDataSwapFn *local_60;
  UDataSwapFn *local_58;
  UDataCompareInvChars *local_50;
  UDataWriteUInt32 *local_48;
  UDataWriteUInt16 *local_40;
  UDataReadUInt32 *local_38;
  UDataReadUInt16 *local_30;
  UDataSwapper *swapper;
  UErrorCode *pErrorCode_local;
  uint8_t outCharset_local;
  UBool outIsBigEndian_local;
  uint8_t inCharset_local;
  UDataSwapper *pUStack_10;
  UBool inIsBigEndian_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    pUStack_10 = (UDataSwapper *)0x0;
  }
  else if ((inCharset < 2) && (outCharset < 2)) {
    pUStack_10 = (UDataSwapper *)uprv_malloc_63(0x60);
    if (pUStack_10 == (UDataSwapper *)0x0) {
      *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
      pUStack_10 = (UDataSwapper *)0x0;
    }
    else {
      memset(pUStack_10,0,0x60);
      pUStack_10->inIsBigEndian = inIsBigEndian;
      pUStack_10->inCharset = inCharset;
      pUStack_10->outIsBigEndian = outIsBigEndian;
      pUStack_10->outCharset = outCharset;
      if (inIsBigEndian == '\0') {
        local_30 = uprv_readDirectUInt16;
      }
      else {
        local_30 = uprv_readSwapUInt16;
      }
      pUStack_10->readUInt16 = local_30;
      if (inIsBigEndian == '\0') {
        local_38 = uprv_readDirectUInt32;
      }
      else {
        local_38 = uprv_readSwapUInt32;
      }
      pUStack_10->readUInt32 = local_38;
      if (outIsBigEndian == '\0') {
        local_40 = uprv_writeDirectUInt16;
      }
      else {
        local_40 = uprv_writeSwapUInt16;
      }
      pUStack_10->writeUInt16 = local_40;
      if (outIsBigEndian == '\0') {
        local_48 = uprv_writeDirectUInt32;
      }
      else {
        local_48 = uprv_writeSwapUInt32;
      }
      pUStack_10->writeUInt32 = local_48;
      if (outCharset == '\0') {
        local_50 = uprv_compareInvAscii_63;
      }
      else {
        local_50 = uprv_compareInvEbcdic_63;
      }
      pUStack_10->compareInvChars = local_50;
      if (inIsBigEndian == outIsBigEndian) {
        pUStack_10->swapArray16 = uprv_copyArray16;
        pUStack_10->swapArray32 = uprv_copyArray32;
        pUStack_10->swapArray64 = uprv_copyArray64;
      }
      else {
        pUStack_10->swapArray16 = uprv_swapArray16;
        pUStack_10->swapArray32 = uprv_swapArray32;
        pUStack_10->swapArray64 = uprv_swapArray64;
      }
      if (inCharset == '\0') {
        if (outCharset == '\0') {
          local_58 = uprv_copyAscii_63;
        }
        else {
          local_58 = uprv_ebcdicFromAscii_63;
        }
        pUStack_10->swapInvChars = local_58;
      }
      else {
        if (outCharset == '\x01') {
          local_60 = uprv_copyEbcdic_63;
        }
        else {
          local_60 = uprv_asciiFromEbcdic_63;
        }
        pUStack_10->swapInvChars = local_60;
      }
    }
  }
  else {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    pUStack_10 = (UDataSwapper *)0x0;
  }
  return pUStack_10;
}

Assistant:

U_CAPI UDataSwapper * U_EXPORT2
udata_openSwapper(UBool inIsBigEndian, uint8_t inCharset,
                  UBool outIsBigEndian, uint8_t outCharset,
                  UErrorCode *pErrorCode) {
    UDataSwapper *swapper;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return NULL;
    }
    if(inCharset>U_EBCDIC_FAMILY || outCharset>U_EBCDIC_FAMILY) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    /* allocate the swapper */
    swapper=(UDataSwapper *)uprv_malloc(sizeof(UDataSwapper));
    if(swapper==NULL) {
        *pErrorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memset(swapper, 0, sizeof(UDataSwapper));

    /* set values and functions pointers according to in/out parameters */
    swapper->inIsBigEndian=inIsBigEndian;
    swapper->inCharset=inCharset;
    swapper->outIsBigEndian=outIsBigEndian;
    swapper->outCharset=outCharset;

    swapper->readUInt16= inIsBigEndian==U_IS_BIG_ENDIAN ? uprv_readDirectUInt16 : uprv_readSwapUInt16;
    swapper->readUInt32= inIsBigEndian==U_IS_BIG_ENDIAN ? uprv_readDirectUInt32 : uprv_readSwapUInt32;

    swapper->writeUInt16= outIsBigEndian==U_IS_BIG_ENDIAN ? uprv_writeDirectUInt16 : uprv_writeSwapUInt16;
    swapper->writeUInt32= outIsBigEndian==U_IS_BIG_ENDIAN ? uprv_writeDirectUInt32 : uprv_writeSwapUInt32;

    swapper->compareInvChars= outCharset==U_ASCII_FAMILY ? uprv_compareInvAscii : uprv_compareInvEbcdic;

    if(inIsBigEndian==outIsBigEndian) {
        swapper->swapArray16=uprv_copyArray16;
        swapper->swapArray32=uprv_copyArray32;
        swapper->swapArray64=uprv_copyArray64;
    } else {
        swapper->swapArray16=uprv_swapArray16;
        swapper->swapArray32=uprv_swapArray32;
        swapper->swapArray64=uprv_swapArray64;
    }

    if(inCharset==U_ASCII_FAMILY) {
        swapper->swapInvChars= outCharset==U_ASCII_FAMILY ? uprv_copyAscii : uprv_ebcdicFromAscii;
    } else /* U_EBCDIC_FAMILY */ {
        swapper->swapInvChars= outCharset==U_EBCDIC_FAMILY ? uprv_copyEbcdic : uprv_asciiFromEbcdic;
    }

    return swapper;
}